

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O3

MPP_RET __thiscall Mpp::decode(Mpp *this,MppPacket packet,MppFrame *frame)

{
  pthread_mutex_t *ppVar1;
  bool bVar2;
  MPP_RET MVar3;
  RK_S32 RVar4;
  size_t sVar5;
  MppBuffer pvVar6;
  
  if (this->mDec == (MppDec)0x0) {
    return MPP_NOK;
  }
  if (this->mInitDone == 0) {
    return MPP_ERR_INIT;
  }
  if (this->mOutputTimeout == MPP_POLL_NON_BLOCK) {
    ppVar1 = (pthread_mutex_t *)this->mFrmOut;
    if (ppVar1 == (pthread_mutex_t *)0x0) {
      RVar4 = mpp_list::list_size((mpp_list *)0x0);
      if (RVar4 != 0) goto LAB_00138680;
    }
    else {
      pthread_mutex_lock(ppVar1);
      RVar4 = mpp_list::list_size(this->mFrmOut);
      if (RVar4 != 0) {
LAB_00138680:
        mpp_list::del_at_head(this->mFrmOut,frame,8);
        pvVar6 = mpp_frame_get_buffer(*frame);
        if (pvVar6 != (MppBuffer)0x0) {
          mpp_buffer_sync_begin_f(pvVar6,1,"decode");
        }
        this->mFrameGetCount = this->mFrameGetCount + 1;
        if (ppVar1 != (pthread_mutex_t *)0x0) {
          pthread_mutex_unlock(ppVar1);
          return MPP_OK;
        }
        return MPP_OK;
      }
      pthread_mutex_unlock(ppVar1);
    }
  }
  do {
    MVar3 = mpp_dec_decode(this->mDec,packet);
    if (packet == (MppPacket)0x0) {
LAB_0013859d:
      bVar2 = false;
    }
    else {
      sVar5 = mpp_packet_get_length(packet);
      bVar2 = true;
      if (sVar5 == 0) goto LAB_0013859d;
    }
    ppVar1 = (pthread_mutex_t *)this->mFrmOut;
    pthread_mutex_lock(ppVar1);
    RVar4 = mpp_list::list_size(this->mFrmOut);
    if (RVar4 != 0) {
      mpp_list::del_at_head(this->mFrmOut,frame,8);
      pvVar6 = mpp_frame_get_buffer(*frame);
      if (pvVar6 != (MppBuffer)0x0) {
        mpp_buffer_sync_begin_f(pvVar6,1,"decode");
      }
      this->mFrameGetCount = this->mFrameGetCount + 1;
    }
    pthread_mutex_unlock(ppVar1);
    if (MVar3 < MPP_OK) {
      return MVar3;
    }
    if (RVar4 != 0) {
      if (MVar3 != MPP_OK) {
        return MPP_OK;
      }
      _mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"ret > 0","decode",0x28e);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
      return MPP_OK;
    }
    if (!bVar2) {
      return MPP_OK;
    }
  } while( true );
}

Assistant:

MPP_RET Mpp::decode(MppPacket packet, MppFrame *frame)
{
    RK_U32 pkt_done = 0;
    RK_S32 frm_rdy = 0;
    MPP_RET ret = MPP_OK;

    if (!mDec)
        return MPP_NOK;

    if (!mInitDone)
        return MPP_ERR_INIT;

    /*
     * If there is frame to return get the frame first
     * But if the output mode is block then we need to send packet first
     */
    if (!mOutputTimeout) {
        AutoMutex autoFrameLock(mFrmOut->mutex());

        if (mFrmOut->list_size()) {
            MppBuffer buffer;

            mFrmOut->del_at_head(frame, sizeof(*frame));
            buffer = mpp_frame_get_buffer(*frame);
            if (buffer)
                mpp_buffer_sync_ro_begin(buffer);
            mFrameGetCount++;
            return MPP_OK;
        }
    }

    do {
        if (!pkt_done)
            ret = mpp_dec_decode(mDec, packet);

        /* check input packet finished or not */
        if (!packet || !mpp_packet_get_length(packet))
            pkt_done = 1;

        /* always try getting frame */
        {
            AutoMutex autoFrameLock(mFrmOut->mutex());

            if (mFrmOut->list_size()) {
                MppBuffer buffer;

                mFrmOut->del_at_head(frame, sizeof(*frame));
                buffer = mpp_frame_get_buffer(*frame);
                if (buffer)
                    mpp_buffer_sync_ro_begin(buffer);
                mFrameGetCount++;
                frm_rdy = 1;
            }
        }

        /* return on flow error */
        if (ret < 0)
            break;

        /* return on output frame is ready */
        if (frm_rdy) {
            mpp_assert(ret > 0);
            ret = MPP_OK;
            break;
        }

        /* return when packet is send and it is a non-block call */
        if (pkt_done) {
            ret = MPP_OK;
            break;
        }

        /* otherwise continue decoding and getting frame */
    } while (1);

    return ret;
}